

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Runtime.cpp
# Opt level: O2

void __thiscall runtime::VirtualMachine::And(VirtualMachine *this)

{
  element_type *peVar1;
  bool bVar2;
  Variable var;
  Variable var_00;
  Variable VVar3;
  Variable VVar4;
  
  VVar3 = popOpStack(this);
  var_00.field_1 = VVar3.field_1;
  VVar4 = popOpStack(this);
  var.field_1 = VVar4.field_1;
  var._4_4_ = 0;
  var.type = VVar4.type;
  bVar2 = booleanValueOfVariable(this,var);
  if (bVar2) {
    var_00._4_4_ = 0;
    var_00.type = VVar3.type;
    bVar2 = booleanValueOfVariable(this,var_00);
  }
  else {
    bVar2 = false;
  }
  pushBoolean(this,bVar2);
  peVar1 = (this->stackFrame).super___shared_ptr<runtime::StackFrame,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  peVar1->programCounter = peVar1->programCounter + 1;
  return;
}

Assistant:

void runtime::VirtualMachine::And() {
  Variable second = this->popOpStack();
  Variable first = this->popOpStack();

  this->pushBoolean(
    this->booleanValueOfVariable(first)
    &&
    this->booleanValueOfVariable(second)
  );
  this->advance();
}